

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

void Scl_LibertyParseDumpItem(FILE *pFile,Scl_Tree_t *p,Scl_Item_t *pItem,int nOffset)

{
  Scl_Item_t *pSVar1;
  int nOffset_local;
  Scl_Item_t *pItem_local;
  Scl_Tree_t *p_local;
  FILE *pFile_local;
  
  if (pItem->Type == 1) {
    Scl_PrintSpace(pFile,nOffset);
    Scl_PrintWord(pFile,p,pItem->Key);
    fprintf((FILE *)pFile,"(");
    Scl_PrintWord(pFile,p,pItem->Head);
    fprintf((FILE *)pFile,") {\n");
    pSVar1 = Scl_LibertyItem(p,pItem->Child);
    if (pSVar1 != (Scl_Item_t *)0x0) {
      pSVar1 = Scl_LibertyItem(p,pItem->Child);
      Scl_LibertyParseDumpItem(pFile,p,pSVar1,nOffset + 2);
    }
    Scl_PrintSpace(pFile,nOffset);
    fprintf((FILE *)pFile,"}\n");
  }
  else if (pItem->Type == 2) {
    Scl_PrintSpace(pFile,nOffset);
    Scl_PrintWord(pFile,p,pItem->Key);
    fprintf((FILE *)pFile," : ");
    Scl_PrintWord(pFile,p,pItem->Head);
    fprintf((FILE *)pFile,";\n");
  }
  else {
    if (pItem->Type != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLiberty.c"
                    ,0x84,"void Scl_LibertyParseDumpItem(FILE *, Scl_Tree_t *, Scl_Item_t *, int)");
    }
    Scl_PrintSpace(pFile,nOffset);
    Scl_PrintWord(pFile,p,pItem->Key);
    fprintf((FILE *)pFile,"(");
    Scl_PrintWord(pFile,p,pItem->Head);
    fprintf((FILE *)pFile,");\n");
  }
  pSVar1 = Scl_LibertyItem(p,pItem->Next);
  if (pSVar1 != (Scl_Item_t *)0x0) {
    pSVar1 = Scl_LibertyItem(p,pItem->Next);
    Scl_LibertyParseDumpItem(pFile,p,pSVar1,nOffset);
  }
  return;
}

Assistant:

void Scl_LibertyParseDumpItem( FILE * pFile, Scl_Tree_t * p, Scl_Item_t * pItem, int nOffset )
{
    if ( pItem->Type == SCL_LIBERTY_PROC )
    {
        Scl_PrintSpace( pFile, nOffset );
        Scl_PrintWord( pFile, p, pItem->Key );
        fprintf( pFile, "(" );
        Scl_PrintWord( pFile, p, pItem->Head );
        fprintf( pFile, ") {\n" );
        if ( Scl_LibertyItem(p, pItem->Child) )
            Scl_LibertyParseDumpItem( pFile, p, Scl_LibertyItem(p, pItem->Child), nOffset + 2 );
        Scl_PrintSpace( pFile, nOffset );
        fprintf( pFile, "}\n" );
    }
    else if ( pItem->Type == SCL_LIBERTY_EQUA )
    {
        Scl_PrintSpace( pFile, nOffset );
        Scl_PrintWord( pFile, p, pItem->Key );
        fprintf( pFile, " : " );
        Scl_PrintWord( pFile, p, pItem->Head );
        fprintf( pFile, ";\n" );
    }
    else if ( pItem->Type == SCL_LIBERTY_LIST )
    {
        Scl_PrintSpace( pFile, nOffset );
        Scl_PrintWord( pFile, p, pItem->Key );
        fprintf( pFile, "(" );
        Scl_PrintWord( pFile, p, pItem->Head );
        fprintf( pFile, ");\n" );
    }
    else assert( 0 );
    if ( Scl_LibertyItem(p, pItem->Next) )
        Scl_LibertyParseDumpItem( pFile, p, Scl_LibertyItem(p, pItem->Next), nOffset );
}